

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::emitTriangleMesh(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  long lVar8;
  pointer psVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  element_type *peVar13;
  element_type *peVar14;
  float fVar15;
  vec3f *v;
  element_type *peVar16;
  element_type *peVar17;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> sVar30;
  SP SVar31;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> alphaParam;
  SP ours;
  undefined1 local_d8 [8];
  element_type *peStack_d0;
  element_type *local_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  SP local_90;
  SP local_80;
  SP local_70;
  SP local_60;
  SP local_50;
  SP local_40;
  _Base_ptr local_30;
  _Base_ptr local_28;
  
  local_30 = *(_Base_ptr *)(*in_RDX + 0x58);
  local_28 = *(_Base_ptr *)(*in_RDX + 0x60);
  if (local_28 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_parent = *(int *)&local_28->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_parent = *(int *)&local_28->_M_parent + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_c0,(SP *)shape);
  std::__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::TriangleMesh>,std::shared_ptr<pbrt::Material>>
            ((__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2> *)local_a0,
             (allocator<pbrt::TriangleMesh> *)local_d8,(shared_ptr<pbrt::Material> *)local_c0);
  if ((_Base_ptr)local_c0._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if (local_28 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (element_type *)(local_c0 + 0x10);
  local_c0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"P","");
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)local_d8,
             (SemanticParser *)shape,&local_40,(string *)local_c0);
  peVar16 = (((SP *)((long)local_a0 + 0x70))->
            super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pp_Var7 = (((element_type *)((long)local_a0 + 0x80))->super_Entity)._vptr_Entity;
  (((SP *)((long)local_a0 + 0x70))->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)local_d8;
  (((SP *)((long)local_a0 + 0x70))->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0;
  (((element_type *)((long)local_a0 + 0x80))->super_Entity)._vptr_Entity = (_func_int **)local_c8;
  local_d8 = (undefined1  [8])0x0;
  peStack_d0 = (element_type *)0x0;
  local_c8 = (element_type *)0x0;
  if ((peVar16 != (element_type *)0x0) &&
     (operator_delete(peVar16,(long)pp_Var7 - (long)peVar16), local_d8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((element_type *)local_c0._0_8_ != peVar1) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"N","");
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)local_d8,
             (SemanticParser *)shape,&local_50,(string *)local_c0);
  peVar17 = (((element_type *)((long)local_a0 + 0x80))->super_Entity).
            super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar8 = (long)(((element_type *)((long)local_a0 + 0x80))->cameras).
                super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (((element_type *)((long)local_a0 + 0x80))->super_Entity).
  super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_d8;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)((long)local_a0 + 0x80))->super_Entity).
          super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0;
  (((element_type *)((long)local_a0 + 0x80))->cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8;
  local_d8 = (undefined1  [8])0x0;
  peStack_d0 = (element_type *)0x0;
  local_c8 = (element_type *)0x0;
  if ((peVar17 != (element_type *)0x0) &&
     (operator_delete(peVar17,lVar8 - (long)peVar17), local_d8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((element_type *)local_c0._0_8_ != peVar1) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  local_c0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"uv","");
  extractVector<pbrt::math::vec2f>
            ((vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)local_d8,
             (SemanticParser *)shape,&local_60,(string *)local_c0);
  psVar9 = *(pointer *)
            ((long)&(((element_type *)((long)local_a0 + 0x80))->cameras).
                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  peVar10 = (((element_type *)((long)local_a0 + 0x80))->film).
            super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined1 (*) [8])
   ((long)&(((element_type *)((long)local_a0 + 0x80))->cameras).
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 8) = local_d8;
  *(element_type **)
   ((long)&(((element_type *)((long)local_a0 + 0x80))->cameras).
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = peStack_d0;
  (((element_type *)((long)local_a0 + 0x80))->film).
  super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  local_d8 = (undefined1  [8])0x0;
  peStack_d0 = (element_type *)0x0;
  local_c8 = (element_type *)0x0;
  if ((psVar9 != (pointer)0x0) &&
     (operator_delete(psVar9,(long)peVar10 - (long)psVar9), local_d8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((element_type *)local_c0._0_8_ != peVar1) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"indices","");
  extractVector<pbrt::math::vec3i>
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)local_d8,
             (SemanticParser *)shape,&local_70,(string *)local_c0);
  p_Var11 = (((element_type *)((long)local_a0 + 0x80))->film).
            super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var12 = (((element_type *)((long)local_a0 + 0x80))->sampler).
            super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (((element_type *)((long)local_a0 + 0x80))->film).
  super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8;
  (((element_type *)((long)local_a0 + 0x80))->sampler).
  super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
  (((element_type *)((long)local_a0 + 0x80))->sampler).
  super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8;
  local_d8 = (undefined1  [8])0x0;
  peStack_d0 = (element_type *)0x0;
  local_c8 = (element_type *)0x0;
  if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (operator_delete(p_Var11,(long)p_Var12 - (long)p_Var11), local_d8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((element_type *)local_c0._0_8_ != peVar1) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lVar8 = *in_RDX;
  fVar2 = *(float *)(lVar8 + 0x78);
  fVar3 = *(float *)(lVar8 + 0x84);
  fVar4 = *(float *)(lVar8 + 0x98);
  peVar16 = (((SP *)((long)local_a0 + 0x70))->
            super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar13 = (element_type *)
            (((SP *)((long)local_a0 + 0x70))->
            super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  fVar25 = (float)*(undefined8 *)(lVar8 + 0x7c);
  fVar26 = (float)((ulong)*(undefined8 *)(lVar8 + 0x7c) >> 0x20);
  fVar28 = (float)((ulong)*(undefined8 *)(lVar8 + 0x88) >> 0x20);
  fVar20 = (float)*(undefined8 *)(lVar8 + 0x90);
  fVar21 = (float)((ulong)*(undefined8 *)(lVar8 + 0x90) >> 0x20);
  fVar27 = (float)*(undefined8 *)(lVar8 + 0x88);
  if (peVar16 != peVar13) {
    uVar6 = *(undefined8 *)(lVar8 + 0x9c);
    fVar19 = *(float *)(lVar8 + 0xa4);
    do {
      fVar22 = *(float *)&(peVar16->super_Entity).super_enable_shared_from_this<pbrt::Entity>.
                          _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>;
      pp_Var7 = (peVar16->super_Entity)._vptr_Entity;
      fVar24 = SUB84(pp_Var7,0);
      fVar29 = (float)((ulong)pp_Var7 >> 0x20);
      (peVar16->super_Entity)._vptr_Entity =
           (_func_int **)
           CONCAT44(fVar22 * fVar21 + fVar27 * fVar29 + fVar25 * fVar24 +
                    (float)((ulong)uVar6 >> 0x20),
                    fVar22 * fVar20 + fVar2 * fVar24 + fVar3 * fVar29 + (float)uVar6);
      *(float *)&(peVar16->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> =
           fVar29 * fVar28 + fVar24 * fVar26 + fVar4 * fVar22 + fVar19;
      peVar16 = (element_type *)
                ((long)&(peVar16->super_Entity).super_enable_shared_from_this<pbrt::Entity> + 4);
    } while (peVar16 != peVar13);
  }
  peVar17 = (((element_type *)((long)local_a0 + 0x80))->super_Entity).
            super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar14 = (element_type *)
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(((element_type *)((long)local_a0 + 0x80))->super_Entity).
                    super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
  if (peVar17 != peVar14) {
    fVar29 = fVar20 * fVar28 - fVar4 * fVar3;
    fVar19 = fVar4 * fVar27 - fVar21 * fVar28;
    fVar22 = fVar21 * fVar3 - fVar20 * fVar27;
    fVar24 = 1.0 / (fVar22 * fVar26 + fVar2 * fVar19 + fVar29 * fVar25);
    do {
      fVar15 = SUB84(peVar17->_vptr_Entity,0);
      fVar23 = (float)((ulong)peVar17->_vptr_Entity >> 0x20);
      fVar5 = *(float *)&(peVar17->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this;
      peVar17->_vptr_Entity =
           (_func_int **)
           CONCAT44(fVar5 * (fVar3 * fVar26 - fVar2 * fVar28) * fVar24 +
                    (fVar2 * fVar4 - fVar26 * fVar20) * fVar24 * fVar23 + fVar29 * fVar24 * fVar15,
                    fVar5 * (fVar28 * fVar25 - fVar26 * fVar27) * fVar24 +
                    fVar19 * fVar24 * fVar15 + (fVar26 * fVar21 - fVar25 * fVar4) * fVar24 * fVar23)
      ;
      *(float *)&(peVar17->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
           fVar15 * fVar24 * fVar22 + fVar23 * (fVar20 * fVar25 - fVar21 * fVar2) * fVar24 +
           fVar5 * fVar24 * (fVar27 * fVar2 - fVar3 * fVar25);
      peVar17 = (element_type *)((long)&peVar17->super_enable_shared_from_this<pbrt::Entity> + 4);
    } while (peVar17 != peVar14);
  }
  local_80.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_98;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_98->_M_use_count = local_98->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_98->_M_use_count = local_98->_M_use_count + 1;
    }
  }
  local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_80,&local_90);
  if ((_Base_ptr)
      local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  lVar8 = *in_RDX;
  local_c0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"alpha","");
  sVar30 = syntactic::ParamSet::findParam<float>((ParamSet *)local_d8,(string *)(lVar8 + 8));
  _Var18 = sVar30.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if ((element_type *)local_c0._0_8_ != peVar1) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
    _Var18._M_pi = extraout_RDX;
  }
  p_Var11 = local_98;
  if (local_d8 != (undefined1  [8])0x0) {
    *(undefined4 *)
     ((long)&(((vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                *)((long)local_a0 + 0x18))->
             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
             )._M_impl.super__Vector_impl_data + 0x14) = **(undefined4 **)((long)local_d8 + 0x18);
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0;
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var11;
  local_a0 = (undefined1  [8])0x0;
  if ((peStack_d0 != (element_type *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0),
     _Var18._M_pi = extraout_RDX_00, local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
     )) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    _Var18._M_pi = extraout_RDX_01;
  }
  SVar31.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var18._M_pi;
  SVar31.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar31.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitTriangleMesh(pbrt::syntactic::Shape::SP shape)
  {
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));

    // vertices - param "P", 3x float each
    ours->vertex = extractVector<vec3f>(shape,"P");
    // vertex normals - param "N", 3x float each
    ours->normal = extractVector<vec3f>(shape,"N");
    // per-vertex texture coordinates - param "uv", 2x float each
    ours->texcoord = extractVector<vec2f>(shape,"uv");
    // triangle vertex indices - param "indices", 3x int each
    ours->index = extractVector<vec3i>(shape,"indices");

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);
    extractTextures(ours,shape);
    
    auto alphaParam = shape->findParam<float>("alpha");
    if (alphaParam) 
      ours->alpha = alphaParam->get(0);
    
    return ours;
  }